

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testharness.cc
# Opt level: O2

string * leveldb::test::TmpDir_abi_cxx11_(void)

{
  Env *pEVar1;
  Tester *this;
  string *in_RDI;
  Status s;
  string local_1d0;
  Tester local_1b0;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  pEVar1 = Env::Default();
  (*pEVar1->_vptr_Env[0x11])(&s,pEVar1);
  Tester::Tester(&local_1b0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/testharness.cc"
                 ,0x43);
  this = Tester::Is(&local_1b0,s.state_ == (char *)0x0,"s.ok()");
  Status::ToString_abi_cxx11_(&local_1d0,&s);
  Tester::operator<<(this,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  Tester::~Tester(&local_1b0);
  Status::~Status(&s);
  return in_RDI;
}

Assistant:

std::string TmpDir() {
  std::string dir;
  Status s = Env::Default()->GetTestDirectory(&dir);
  ASSERT_TRUE(s.ok()) << s.ToString();
  return dir;
}